

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DSAPublicKey.cpp
# Opt level: O2

ByteString * __thiscall
DSAPublicKey::serialise(ByteString *__return_storage_ptr__,DSAPublicKey *this)

{
  ByteString local_100;
  ByteString local_d8;
  ByteString local_b0;
  ByteString local_88;
  ByteString local_60;
  ByteString local_38;
  
  ByteString::serialise(&local_88,&this->p);
  ByteString::serialise(&local_b0,&this->q);
  operator+(&local_60,&local_88,&local_b0);
  ByteString::serialise(&local_d8,&this->g);
  operator+(&local_38,&local_60,&local_d8);
  ByteString::serialise(&local_100,&this->y);
  operator+(__return_storage_ptr__,&local_38,&local_100);
  ByteString::~ByteString(&local_100);
  ByteString::~ByteString(&local_38);
  ByteString::~ByteString(&local_d8);
  ByteString::~ByteString(&local_60);
  ByteString::~ByteString(&local_b0);
  ByteString::~ByteString(&local_88);
  return __return_storage_ptr__;
}

Assistant:

ByteString DSAPublicKey::serialise() const
{
	return p.serialise() +
	       q.serialise() +
	       g.serialise() +
	       y.serialise();
}